

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  ExprList *this_00;
  ElemExprVector *out_list;
  ElemSegmentModuleField *pEVar1;
  bool bVar2;
  Result RVar3;
  reference pvVar4;
  size_type sVar5;
  Enum EVar6;
  TableImport *pTVar7;
  ElemSegmentModuleField *local_150;
  Type elem_type;
  Location local_138;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_110;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_108;
  _Head_base<0UL,_wabt::TableImport_*,_false> local_100;
  Expr *local_f8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_f0;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_e8;
  string name;
  Location loc;
  ElemExpr elem_expr;
  ModuleFieldList export_fields;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar3 = Expect(this,Table);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  EVar6 = Error;
  RVar3 = ParseInlineExports(this,&export_fields,Table);
  if (RVar3.enum_ == Error) goto LAB_0016d3a8;
  bVar2 = PeekMatchLpar(this,Import);
  if (bVar2) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::TableImport,std::__cxx11::string&>((wabt *)&local_138,&name);
    RVar3 = ParseInlineImport(this,(Import *)local_138.filename.data_);
    pTVar7 = (TableImport *)local_138.filename.data_;
    if (((RVar3.enum_ == Error) ||
        (RVar3 = ParseLimits(this,&((Table *)((long)local_138.filename.data_ + 0x50))->elem_limits),
        pTVar7 = (TableImport *)local_138.filename.data_, RVar3.enum_ == Error)) ||
       (RVar3 = ParseRefType(this,&((Table *)((long)local_138.filename.data_ + 0x50))->elem_type),
       pTVar7 = (TableImport *)local_138.filename.data_, RVar3.enum_ == Error)) {
LAB_0016d2a2:
      if (pTVar7 != (TableImport *)0x0) {
        (*(pTVar7->super_ImportMixin<(wabt::ExternalKind)1>).super_Import._vptr_Import[1])();
      }
      goto LAB_0016d3a8;
    }
    GetLocation((Location *)&elem_expr,this);
    MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
              ((wabt *)&local_150,
               (unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)&local_138,
               (Location *)&elem_expr);
    local_e8._M_head_impl = (ImportModuleField *)local_150;
    local_150 = (ElemSegmentModuleField *)0x0;
    Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&local_e8);
    if (local_e8._M_head_impl != (ImportModuleField *)0x0) {
      (*((local_e8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField[1])();
    }
    local_e8._M_head_impl = (ImportModuleField *)0x0;
    pTVar7 = (TableImport *)local_138.filename.data_;
    if (local_150 != (ElemSegmentModuleField *)0x0) {
      (*(((ModuleFieldMixin<(wabt::ModuleFieldType)2> *)
         &local_150->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>)->super_ModuleField).
        _vptr_ModuleField[1])();
      pTVar7 = (TableImport *)local_138.filename.data_;
    }
LAB_0016d365:
    if (pTVar7 != (TableImport *)0x0) {
      (*(pTVar7->super_ImportMixin<(wabt::ExternalKind)1>).super_Import._vptr_Import[1])();
    }
  }
  else {
    bVar2 = PeekMatch(this,First_Type);
    if (!bVar2) {
      MakeUnique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((wabt *)&elem_expr,&loc,&name);
      RVar3 = ParseLimits(this,(Limits *)(elem_expr._0_8_ + 0x60));
      pTVar7 = (TableImport *)elem_expr._0_8_;
      if ((RVar3.enum_ == Error) ||
         (RVar3 = ParseRefType(this,(Type *)(elem_expr._0_8_ + 0x78)),
         pTVar7 = (TableImport *)elem_expr._0_8_, RVar3.enum_ == Error)) goto LAB_0016d2a2;
      local_110._M_head_impl = (TableModuleField *)elem_expr._0_8_;
      elem_expr.kind = RefNull;
      elem_expr._4_4_ = 0;
      Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                  *)&local_110);
      if (local_110._M_head_impl != (TableModuleField *)0x0) {
        (*((local_110._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_110._M_head_impl = (TableModuleField *)0x0;
      pTVar7 = (TableImport *)elem_expr._0_8_;
      goto LAB_0016d365;
    }
    RVar3 = ParseRefType(this,&elem_type);
    if (((RVar3.enum_ == Error) || (RVar3 = Expect(this,Lpar), RVar3.enum_ == Error)) ||
       (RVar3 = Expect(this,Elem), RVar3.enum_ == Error)) goto LAB_0016d3a8;
    MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&>((wabt *)&local_150,&loc);
    pEVar1 = local_150;
    local_138.field_1.field_0.line = 0;
    local_138.field_1._4_8_ = 0;
    local_138.filename.data_ = (char *)0x0;
    local_138.filename.size_._0_4_ = 0;
    local_138.filename.size_._4_4_ = 0;
    Var::Var((Var *)&elem_expr,
             (Index)((ulong)((long)(module->tables).
                                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(module->tables).
                                  super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3),&local_138);
    Var::operator=(&(pEVar1->elem_segment).table_var,(Var *)&elem_expr);
    Var::~Var((Var *)&elem_expr);
    this_00 = &(pEVar1->elem_segment).offset;
    local_138.field_1.field_0.line = 0;
    local_138.field_1._4_8_ = 0;
    local_138.filename.data_ = (char *)0x0;
    local_138.filename.size_._0_4_ = 0;
    local_138.filename.size_._4_4_ = 0;
    Const::I32((Const *)&elem_expr,0,&local_138);
    MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_f8,(Const *)&elem_expr);
    local_f0._M_head_impl = local_f8;
    local_f8 = (Expr *)0x0;
    intrusive_list<wabt::Expr>::push_back
              (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
    if (local_f0._M_head_impl != (Expr *)0x0) {
      (*(local_f0._M_head_impl)->_vptr_Expr[1])();
    }
    local_f0._M_head_impl = (Expr *)0x0;
    if (local_f8 != (Expr *)0x0) {
      (*local_f8->_vptr_Expr[1])();
    }
    pvVar4 = intrusive_list<wabt::Expr>::back(this_00);
    (pvVar4->loc).filename.data_ = loc.filename.data_;
    (pvVar4->loc).filename.size_ = loc.filename.size_;
    (pvVar4->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pvVar4->loc).field_1 + 8) = loc.field_1._8_8_;
    (pEVar1->elem_segment).elem_type.enum_ = elem_type.enum_;
    ElemExpr::ElemExpr(&elem_expr);
    bVar2 = ParseElemExprOpt(this,&elem_expr);
    out_list = &(pEVar1->elem_segment).elem_exprs;
    if (bVar2) {
      std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::push_back(out_list,&elem_expr);
      ParseElemExprListOpt(this,out_list);
    }
    else {
      ParseElemExprVarListOpt(this,out_list);
    }
    RVar3 = Expect(this,Rpar);
    if (RVar3.enum_ != Error) {
      MakeUnique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
                ((wabt *)&local_138,&loc,&name);
      sVar5 = ((long)(pEVar1->elem_segment).elem_exprs.
                     super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(pEVar1->elem_segment).elem_exprs.
                    super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x58;
      (((Table *)((long)local_138.filename.data_ + 0x50))->name).field_2._M_allocated_capacity =
           sVar5;
      *(size_type *)((long)&(((Table *)((long)local_138.filename.data_ + 0x50))->name).field_2 + 8)
           = sVar5;
      *(undefined1 *)&(((Table *)((long)local_138.filename.data_ + 0x50))->elem_limits).initial = 1;
      *(Enum *)&(((Table *)((long)local_138.filename.data_ + 0x50))->elem_limits).max =
           elem_type.enum_;
      local_100._M_head_impl = (TableImport *)local_138.filename.data_;
      local_138.filename.data_ = (char *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                                  *)&local_100);
      if (local_100._M_head_impl != (TableImport *)0x0) {
        (*((local_100._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.
          _vptr_Import[1])();
      }
      local_100._M_head_impl = (TableImport *)0x0;
      local_108._M_head_impl = local_150;
      local_150 = (ElemSegmentModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                  *)&local_108);
      if (local_108._M_head_impl != (ElemSegmentModuleField *)0x0) {
        (*(((ModuleFieldMixin<(wabt::ModuleFieldType)2> *)
           &(local_108._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>)->
          super_ModuleField)._vptr_ModuleField[1])();
      }
      local_108._M_head_impl = (ElemSegmentModuleField *)0x0;
      if ((TableImport *)local_138.filename.data_ != (TableImport *)0x0) {
        (*(((ImportMixin<(wabt::ExternalKind)1> *)local_138.filename.data_)->super_Import).
          _vptr_Import[1])();
      }
    }
    Var::~Var(&elem_expr.var);
    if (local_150 != (ElemSegmentModuleField *)0x0) {
      (*(((ModuleFieldMixin<(wabt::ModuleFieldType)2> *)
         &local_150->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>)->super_ModuleField).
        _vptr_ModuleField[1])();
    }
    if (RVar3.enum_ == Error) goto LAB_0016d3a8;
  }
  anon_unknown_1::AppendInlineExportFields
            (module,&export_fields,
             (int)((ulong)((long)(module->tables).
                                 super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(module->tables).
                                super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  RVar3 = Expect(this,Rpar);
  EVar6 = (Enum)(RVar3.enum_ == Error);
LAB_0016d3a8:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else if (PeekMatch(TokenType::ValueType)) {
    Type elem_type;
    CHECK_RESULT(ParseRefType(&elem_type));

    EXPECT(Lpar);
    EXPECT(Elem);

    auto elem_segment_field = MakeUnique<ElemSegmentModuleField>(loc);
    ElemSegment& elem_segment = elem_segment_field->elem_segment;
    elem_segment.table_var = Var(module->tables.size());
    elem_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
    elem_segment.offset.back().loc = loc;
    elem_segment.elem_type = elem_type;
    // Syntax is either an optional list of var (legacy), or a non-empty list
    // of elem expr.
    ElemExpr elem_expr;
    if (ParseElemExprOpt(&elem_expr)) {
      elem_segment.elem_exprs.push_back(elem_expr);
      // Parse the rest.
      ParseElemExprListOpt(&elem_segment.elem_exprs);
    } else {
      ParseElemExprVarListOpt(&elem_segment.elem_exprs);
    }
    EXPECT(Rpar);

    auto table_field = MakeUnique<TableModuleField>(loc, name);
    table_field->table.elem_limits.initial = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.max = elem_segment.elem_exprs.size();
    table_field->table.elem_limits.has_max = true;
    table_field->table.elem_type = elem_type;
    module->AppendField(std::move(table_field));
    module->AppendField(std::move(elem_segment_field));
  } else {
    auto field = MakeUnique<TableModuleField>(loc, name);
    CHECK_RESULT(ParseLimits(&field->table.elem_limits));
    CHECK_RESULT(ParseRefType(&field->table.elem_type));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}